

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O3

SiameseResult siamese_decoder_stats(SiameseDecoder decoder_t,uint64_t *statsOut,uint statsCount)

{
  SiameseResult SVar1;
  Decoder *decoder;
  
  if (statsCount == 0 || (statsOut == (uint64_t *)0x0 || decoder_t == (SiameseDecoder)0x0)) {
    return Siamese_InvalidInput;
  }
  SVar1 = siamese::Decoder::GetStatistics((Decoder *)decoder_t,statsOut,statsCount);
  return SVar1;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decoder_stats(
    SiameseDecoder decoder_t,
    uint64_t* statsOut,
    unsigned statsCount)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || !statsOut || statsCount <= 0)
        return Siamese_InvalidInput;

    return decoder->GetStatistics(
        statsOut,
        statsCount);
}